

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.h
# Opt level: O3

void icu_63::UnifiedCache::getByLocale<icu_63::SharedCalendar>
               (Locale *loc,SharedCalendar **ptr,UErrorCode *status)

{
  UnifiedCache *this;
  LocaleCacheKey<icu_63::SharedCalendar> local_118;
  
  this = getInstance(status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    LocaleCacheKey<icu_63::SharedCalendar>::LocaleCacheKey(&local_118,loc);
    get<icu_63::SharedCalendar>
              (this,&local_118.super_CacheKey<icu_63::SharedCalendar>,(void *)0x0,ptr,status);
    local_118.super_CacheKey<icu_63::SharedCalendar>.super_CacheKeyBase.super_UObject._vptr_UObject
         = (_func_int **)&PTR__LocaleCacheKey_00473318;
    Locale::~Locale(&local_118.fLoc);
    CacheKeyBase::~CacheKeyBase((CacheKeyBase *)&local_118);
  }
  return;
}

Assistant:

static void getByLocale(
           const Locale &loc, const T *&ptr, UErrorCode &status) {
       const UnifiedCache *cache = getInstance(status);
       if (U_FAILURE(status)) {
           return;
       }
       cache->get(LocaleCacheKey<T>(loc), ptr, status);
   }